

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void get_rgb_color(RK_U32 *R,RK_U32 *G,RK_U32 *B,RK_S32 x,RK_S32 y,RK_S32 frm_cnt)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  RK_U32 local_54;
  RK_U32 local_50;
  RK_U32 local_4c;
  RK_U32 local_48;
  RK_U32 local_44;
  RK_U32 local_40;
  RK_S32 _B;
  RK_S32 _G;
  RK_S32 _R;
  RK_U8 V;
  RK_U8 U;
  RK_U8 Y;
  RK_S32 frm_cnt_local;
  RK_S32 y_local;
  RK_S32 x_local;
  RK_U32 *B_local;
  RK_U32 *G_local;
  RK_U32 *R_local;
  
  if (frm_cnt == 0) {
    *R = 0xff;
    *G = 0;
    *B = 0;
  }
  else if (frm_cnt == 1) {
    *R = 0;
    *G = 0xff;
    *B = 0;
  }
  else if (frm_cnt == 2) {
    *R = 0;
    *G = 0;
    *B = 0xff;
  }
  else {
    bVar1 = (char)x + (char)y + (char)frm_cnt * '\x03';
    bVar2 = (char)(y / 2) + -0x80 + (char)(frm_cnt << 1);
    bVar3 = (char)(x / 2) + '@' + (char)frm_cnt * '\x05';
    local_44 = (uint)bVar1 + ((int)((bVar3 - 0x80) * 0x168) >> 8);
    local_4c = (uint)bVar1 - ((int)((bVar2 - 0x80) * 0x58 + (bVar3 - 0x80) * 0xb8) >> 8);
    local_54 = (uint)bVar1 + ((int)((bVar2 - 0x80) * 0x1c7) >> 8);
    if ((int)local_44 < 0) {
      local_40 = 0;
    }
    else {
      if (0xff < (int)local_44) {
        local_44 = 0xff;
      }
      local_40 = local_44;
    }
    *R = local_40;
    if ((int)local_4c < 0) {
      local_48 = 0;
    }
    else {
      if (0xff < (int)local_4c) {
        local_4c = 0xff;
      }
      local_48 = local_4c;
    }
    *G = local_48;
    if ((int)local_54 < 0) {
      local_50 = 0;
    }
    else {
      if (0xff < (int)local_54) {
        local_54 = 0xff;
      }
      local_50 = local_54;
    }
    *B = local_50;
  }
  return;
}

Assistant:

static void get_rgb_color(RK_U32 *R, RK_U32 *G, RK_U32 *B, RK_S32 x, RK_S32 y, RK_S32 frm_cnt)
{
    // frame 0 -> red
    if (frm_cnt == 0) {
        R[0] = 0xff;
        G[0] = 0;
        B[0] = 0;
        return ;
    }

    // frame 1 -> green
    if (frm_cnt == 1) {
        R[0] = 0;
        G[0] = 0xff;
        B[0] = 0;
        return ;
    }

    // frame 2 -> blue
    if (frm_cnt == 2) {
        R[0] = 0;
        G[0] = 0;
        B[0] = 0xff;
        return ;
    }

    // moving color bar
    RK_U8 Y = (0   +  x + y  + frm_cnt * 3);
    RK_U8 U = (128 + (y / 2) + frm_cnt * 2);
    RK_U8 V = (64  + (x / 2) + frm_cnt * 5);

    RK_S32 _R = Y + ((360 * (V - 128)) >> 8);
    RK_S32 _G = Y - (((88 * (U - 128) + 184 * (V - 128))) >> 8);
    RK_S32 _B = Y + ((455 * (U - 128)) >> 8);

    R[0] = MPP_CLIP3(0, 255, _R);
    G[0] = MPP_CLIP3(0, 255, _G);
    B[0] = MPP_CLIP3(0, 255, _B);
}